

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkBorderColor Diligent::BorderColorToVkBorderColor(Float32 *BorderColor)

{
  undefined *puVar1;
  undefined8 uVar2;
  undefined1 local_38 [8];
  string _msg;
  VkBorderColor vkBorderColor;
  Float32 *BorderColor_local;
  
  _msg.field_2._12_4_ = 0;
  if (((((float)*BorderColor != 0.0) || (NAN((float)*BorderColor))) ||
      ((float)BorderColor[1] != 0.0)) ||
     (((NAN((float)BorderColor[1]) || ((float)BorderColor[2] != 0.0)) ||
      ((NAN((float)BorderColor[2]) ||
       (((float)BorderColor[3] != 0.0 || (NAN((float)BorderColor[3]))))))))) {
    if (((float)*BorderColor != 0.0) ||
       (((((NAN((float)*BorderColor) || ((float)BorderColor[1] != 0.0)) ||
          (NAN((float)BorderColor[1]))) ||
         (((float)BorderColor[2] != 0.0 || (NAN((float)BorderColor[2]))))) ||
        (((float)BorderColor[3] != 1.0 || (NAN((float)BorderColor[3]))))))) {
      if ((((((float)*BorderColor != 1.0) || (NAN((float)*BorderColor))) ||
           ((float)BorderColor[1] != 1.0)) ||
          (((NAN((float)BorderColor[1]) || ((float)BorderColor[2] != 1.0)) ||
           (NAN((float)BorderColor[2]))))) ||
         (((float)BorderColor[3] != 1.0 || (NAN((float)BorderColor[3]))))) {
        FormatString<char[123]>
                  ((string *)local_38,
                   (char (*) [123])
                   "Vulkan samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors."
                  );
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar2 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(2,uVar2,0);
        }
        std::__cxx11::string::~string((string *)local_38);
      }
      else {
        _msg.field_2._12_4_ = 4;
      }
    }
    else {
      _msg.field_2._12_4_ = 2;
    }
  }
  else {
    _msg.field_2._12_4_ = 0;
  }
  return _msg.field_2._12_4_;
}

Assistant:

VkBorderColor BorderColorToVkBorderColor(const Float32 BorderColor[])
{
    VkBorderColor vkBorderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    if (BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 0)
        vkBorderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    else if (BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 1)
        vkBorderColor = VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK;
    else if (BorderColor[0] == 1 && BorderColor[1] == 1 && BorderColor[2] == 1 && BorderColor[3] == 1)
        vkBorderColor = VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
    else
    {
        LOG_ERROR_MESSAGE("Vulkan samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors.");
    }

    return vkBorderColor;
}